

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unix.c
# Opt level: O1

int enet_socket_bind(ENetSocket socket,ENetAddress *address)

{
  int iVar1;
  sockaddr local_18;
  
  local_18.sa_data[6] = '\0';
  local_18.sa_data[7] = '\0';
  local_18.sa_data[8] = '\0';
  local_18.sa_data[9] = '\0';
  local_18.sa_data[10] = '\0';
  local_18.sa_data[0xb] = '\0';
  local_18.sa_data[0xc] = '\0';
  local_18.sa_data[0xd] = '\0';
  if (address == (ENetAddress *)0x0) {
    local_18.sa_family = 2;
    local_18.sa_data[0] = '\0';
    local_18.sa_data[1] = '\0';
    local_18.sa_data._2_4_ = 0;
  }
  else {
    local_18.sa_data._0_2_ = address->port << 8 | address->port >> 8;
    local_18.sa_family = 2;
    local_18.sa_data._2_4_ = address->host;
  }
  local_18.sa_family = local_18.sa_family;
  local_18.sa_data[0] = local_18.sa_data[0];
  local_18.sa_data[1] = local_18.sa_data[1];
  iVar1 = bind(socket,&local_18,0x10);
  return iVar1;
}

Assistant:

int
enet_socket_bind (ENetSocket socket, const ENetAddress * address)
{
    struct sockaddr_in sin;

    memset (& sin, 0, sizeof (struct sockaddr_in));

    sin.sin_family = AF_INET;

    if (address != NULL)
    {
       sin.sin_port = ENET_HOST_TO_NET_16 (address -> port);
       sin.sin_addr.s_addr = address -> host;
    }
    else
    {
       sin.sin_port = 0;
       sin.sin_addr.s_addr = INADDR_ANY;
    }

    return bind (socket,
                 (struct sockaddr *) & sin,
                 sizeof (struct sockaddr_in)); 
}